

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>::
DescribeDefaultActionTo
          (FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)> *this,ArgumentTuple *args,
          ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  int in_ECX;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)> *this_00;
  string local_50;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_00 = (OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)> *)0x0;
      break;
    }
    this_00 = (OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar1 = OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)>::Matches(this_00,args);
  } while (!bVar1);
  if (this_00 != (OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"taking default action specified at:\n",0x24);
    FormatFileLocation_abi_cxx11_
              (&local_50,*(internal **)this_00,(char *)(ulong)*(uint *)(this_00 + 8),in_ECX);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"returning default value.\n",0x19);
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == NULL) {
      *os << (internal::type_equals<Result, void>::value ?
              "returning directly.\n" :
              "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }